

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

char * curl_easy_escape(CURL *data,char *string,int inlength)

{
  CURLcode CVar1;
  char *pcVar2;
  size_t local_60;
  undefined2 local_54;
  undefined1 local_52;
  byte local_51;
  undefined1 local_50 [4];
  uchar out [3];
  uchar in;
  dynbuf d;
  size_t length;
  byte *pbStack_20;
  int inlength_local;
  char *string_local;
  CURL *data_local;
  
  if ((string == (char *)0x0) || (inlength < 0)) {
    data_local = (CURL *)0x0;
  }
  else {
    if (inlength == 0) {
      local_60 = strlen(string);
    }
    else {
      local_60 = (size_t)inlength;
    }
    d.toobig = local_60;
    if (local_60 == 0) {
      data_local = (*Curl_cstrdup)("");
    }
    else {
      Curl_dyn_init((dynbuf *)local_50,local_60 * 3 + 1);
      pbStack_20 = (byte *)string;
      do {
        while( true ) {
          if (d.toobig == 0) {
            pcVar2 = Curl_dyn_ptr((dynbuf *)local_50);
            return pcVar2;
          }
          local_51 = *pbStack_20;
          if (((((0x2f < local_51) && (local_51 < 0x3a)) || ((0x60 < local_51 && (local_51 < 0x7b)))
               ) || ((((0x40 < local_51 && (local_51 < 0x5b)) || (local_51 == 0x2d)) ||
                     ((local_51 == 0x2e || (local_51 == 0x5f)))))) || (local_51 == 0x7e)) break;
          local_54 = 0x25;
          local_52 = 0;
          Curl_hexbyte((uchar *)((long)&local_54 + 1),local_51,false);
          CVar1 = Curl_dyn_addn((dynbuf *)local_50,&local_54,3);
          d.toobig = d.toobig - 1;
          pbStack_20 = pbStack_20 + 1;
          if (CVar1 != CURLE_OK) {
            return (char *)0x0;
          }
        }
        CVar1 = Curl_dyn_addn((dynbuf *)local_50,&local_51,1);
        d.toobig = d.toobig - 1;
        pbStack_20 = pbStack_20 + 1;
      } while (CVar1 == CURLE_OK);
      data_local = (CURL *)0x0;
    }
  }
  return (char *)data_local;
}

Assistant:

char *curl_easy_escape(CURL *data, const char *string,
                       int inlength)
{
  size_t length;
  struct dynbuf d;
  (void)data;

  if(!string || (inlength < 0))
    return NULL;

  length = (inlength ? (size_t)inlength : strlen(string));
  if(!length)
    return strdup("");

  Curl_dyn_init(&d, length * 3 + 1);

  while(length--) {
    /* treat the characters unsigned */
    unsigned char in = (unsigned char)*string++;

    if(ISUNRESERVED(in)) {
      /* append this */
      if(Curl_dyn_addn(&d, &in, 1))
        return NULL;
    }
    else {
      /* encode it */
      unsigned char out[3]={'%'};
      Curl_hexbyte(&out[1], in, FALSE);
      if(Curl_dyn_addn(&d, out, 3))
        return NULL;
    }
  }

  return Curl_dyn_ptr(&d);
}